

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::TransformerLogLog>::operator()
          (StairsRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  unsigned_long_long uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ImVec2 IVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterYs<unsigned_long_long> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  ImPlotContext *pIVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  pIVar17 = GImPlot;
  pGVar8 = this->Getter;
  pTVar9 = this->Transformer;
  iVar18 = pGVar8->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar8->Ys +
           (long)(((prim + 1 + pGVar8->Offset) % iVar18 + iVar18) % iVar18) * (long)pGVar8->Stride);
  dVar13 = log10(((double)(prim + 1) * pGVar8->XScale + pGVar8->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar17->CurrentPlot;
  dVar2 = pIVar17->LogDenX;
  dVar3 = (pIVar10->XAxis).Range.Min;
  dVar4 = (pIVar10->XAxis).Range.Max;
  dVar14 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar18 = pTVar9->YAxis;
  pIVar10 = pIVar17->CurrentPlot;
  auVar22._8_8_ = dVar14;
  auVar22._0_8_ = dVar13;
  auVar23._8_4_ = SUB84(pIVar17->LogDenY[iVar18],0);
  auVar23._0_8_ = dVar2;
  auVar23._12_4_ = (int)((ulong)pIVar17->LogDenY[iVar18] >> 0x20);
  auVar23 = divpd(auVar22,auVar23);
  dVar2 = pIVar10->YAxis[iVar18].Range.Min;
  IVar5 = pIVar17->PixelRange[iVar18].Min;
  fVar19 = (float)(pIVar17->Mx *
                   (((double)(float)auVar23._0_8_ * (dVar4 - dVar3) + dVar3) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar5.x);
  fVar20 = (float)(pIVar17->My[iVar18] *
                   (((double)(float)auVar23._8_8_ * (pIVar10->YAxis[iVar18].Range.Max - dVar2) +
                    dVar2) - dVar2) + (double)IVar5.y);
  fVar21 = (this->P1).x;
  fVar24 = (this->P1).y;
  auVar26._0_4_ = ~-(uint)(fVar19 <= fVar21) & (uint)fVar19;
  auVar26._4_4_ = ~-(uint)(fVar20 <= fVar24) & (uint)fVar20;
  auVar26._8_4_ = ~-(uint)(fVar21 < fVar19) & (uint)fVar19;
  auVar26._12_4_ = ~-(uint)(fVar24 < fVar20) & (uint)fVar20;
  auVar15._4_4_ = (uint)fVar24 & -(uint)(fVar20 <= fVar24);
  auVar15._0_4_ = (uint)fVar21 & -(uint)(fVar19 <= fVar21);
  auVar15._8_4_ = (uint)fVar21 & -(uint)(fVar21 < fVar19);
  auVar15._12_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar20);
  auVar26 = auVar26 | auVar15;
  fVar25 = (cull_rect->Min).y;
  auVar16._4_8_ = auVar26._8_8_;
  auVar16._0_4_ = -(uint)(auVar26._4_4_ < fVar25);
  auVar27._0_8_ = auVar16._0_8_ << 0x20;
  auVar27._8_4_ = -(uint)(auVar26._8_4_ < (cull_rect->Max).x);
  auVar27._12_4_ = -(uint)(auVar26._12_4_ < (cull_rect->Max).y);
  auVar28._4_4_ = -(uint)(fVar25 < auVar26._4_4_);
  auVar28._0_4_ = -(uint)((cull_rect->Min).x < auVar26._0_4_);
  auVar28._8_8_ = auVar27._8_8_;
  iVar18 = movmskps((int)pIVar10,auVar28);
  if (iVar18 == 0xf) {
    fVar25 = fVar24 + this->HalfWeight;
    fVar24 = fVar24 - this->HalfWeight;
    IVar6 = this->Col;
    IVar5 = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = fVar21;
    (pIVar11->pos).y = fVar25;
    DrawList->_VtxWritePtr->uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar19;
    pIVar11[1].pos.y = fVar24;
    DrawList->_VtxWritePtr[1].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar21;
    pIVar11[2].pos.y = fVar24;
    pIVar11[2].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar19;
    pIVar11[3].pos.y = fVar25;
    pIVar11[3].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar12 = DrawList->_IdxWritePtr;
    *puVar12 = uVar7;
    puVar12[1] = uVar7 + 1;
    puVar12[2] = DrawList->_VtxCurrentIdx + 2;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar12[3] = uVar7;
    puVar12[4] = uVar7 + 1;
    puVar12[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar12 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar24 = fVar19 - this->HalfWeight;
    fVar21 = this->HalfWeight + fVar19;
    fVar25 = (this->P1).y;
    IVar6 = this->Col;
    IVar5 = *uv;
    pIVar11[4].pos.x = fVar24;
    pIVar11[4].pos.y = fVar20;
    DrawList->_VtxWritePtr->uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar21;
    pIVar11[1].pos.y = fVar25;
    DrawList->_VtxWritePtr[1].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar24;
    pIVar11[2].pos.y = fVar25;
    pIVar11[2].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar21;
    pIVar11[3].pos.y = fVar20;
    pIVar11[3].uv = IVar5;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar12 = DrawList->_IdxWritePtr;
    *puVar12 = uVar7;
    puVar12[1] = uVar7 + 1;
    puVar12[2] = DrawList->_VtxCurrentIdx + 2;
    uVar7 = DrawList->_VtxCurrentIdx;
    puVar12[3] = uVar7;
    puVar12[4] = uVar7 + 1;
    puVar12[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar12 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar5.y = fVar20;
  IVar5.x = fVar19;
  this->P1 = IVar5;
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }